

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O2

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue)

{
  undefined1 auVar1 [16];
  char cVar2;
  byte bVar3;
  short sVar4;
  ulong uVar5;
  size_t sVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  short *psVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  
  uVar12 = 0xb;
  if (tableLog != 0) {
    uVar12 = (ulong)tableLog;
  }
  uVar16 = (uint)uVar12;
  sVar6 = 0xffffffffffffffff;
  if (4 < uVar16) {
    if (uVar16 < 0xd) {
      uVar9 = 0x1f;
      if ((uint)total != 0) {
        for (; (uint)total >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar11 = (uVar9 ^ 0xffffffe0) + 0x21;
      uVar9 = 0x1f;
      if (maxSymbolValue != 0) {
        for (; maxSymbolValue >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (uVar9 ^ 0xffffffe0) + 0x22;
      if (uVar11 < uVar9) {
        uVar9 = uVar11;
      }
      if (uVar9 <= uVar16) {
        bVar3 = (byte)uVar12;
        cVar2 = -bVar3;
        bVar7 = cVar2 + 0x3e;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = total;
        uVar9 = 1 << (bVar3 & 0x1f);
        uVar18 = 0;
        uVar5 = 0;
        uVar16 = uVar9;
        for (uVar11 = 0; uVar17 = (uint)(total >> (bVar3 & 0x3f)), uVar11 <= maxSymbolValue;
            uVar11 = uVar11 + 1) {
          uVar15 = (ulong)count[uVar11];
          if (uVar15 == total) {
            return 0;
          }
          if (uVar15 == 0) {
            normalizedCounter[uVar11] = 0;
          }
          else if (uVar17 < count[uVar11]) {
            uVar15 = uVar15 * SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
            uVar14 = uVar15 >> (bVar7 & 0x3f);
            if ((uVar14 & 0xfff8) == 0) {
              uVar14 = (ulong)((int)uVar14 +
                              (uint)((ulong)FSE_normalizeCount::rtbTable[uVar14 & 0xffff] <<
                                     (cVar2 + 0x2aU & 0x3f) <
                                    uVar15 - ((uVar14 & 0xffff) << (bVar7 & 0x3f))));
            }
            uVar8 = (ushort)uVar14;
            if ((ushort)uVar5 < uVar8) {
              uVar18 = (ulong)uVar11;
            }
            if ((ushort)uVar5 < uVar8) {
              uVar5 = uVar14 & 0xffff;
            }
            normalizedCounter[uVar11] = uVar8;
            uVar16 = uVar16 - (int)(uVar14 & 0xffff);
          }
          else {
            normalizedCounter[uVar11] = -1;
            uVar16 = uVar16 - 1;
          }
        }
        sVar4 = normalizedCounter[uVar18];
        iVar13 = (int)sVar4 >> 1;
        if (iVar13 == -uVar16 || SBORROW4(iVar13,-uVar16) != (int)(iVar13 + uVar16) < 0) {
          uVar15 = total * 3 >> (bVar3 + 1 & 0x3f);
          uVar18 = (ulong)(maxSymbolValue + 1);
          uVar11 = 0;
          for (uVar5 = 0; uVar18 != uVar5; uVar5 = uVar5 + 1) {
            uVar16 = count[uVar5];
            if ((ulong)uVar16 == 0) {
              normalizedCounter[uVar5] = 0;
            }
            else {
              if (uVar17 < uVar16) {
                if ((uint)uVar15 < uVar16) {
                  normalizedCounter[uVar5] = -2;
                  goto LAB_0013d7f3;
                }
                normalizedCounter[uVar5] = 1;
              }
              else {
                normalizedCounter[uVar5] = -1;
              }
              uVar11 = uVar11 + 1;
              total = total - uVar16;
            }
LAB_0013d7f3:
          }
          uVar16 = uVar9 - uVar11;
          if (uVar16 == 0) {
            return uVar12;
          }
          if ((uVar15 & 0xffffffff) < total / uVar16) {
            uVar5 = total * 3;
            for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
              if ((normalizedCounter[uVar15] == -2) &&
                 (uVar17 = count[uVar15], uVar17 <= (uint)(uVar5 / (uVar16 * 2)))) {
                normalizedCounter[uVar15] = 1;
                uVar11 = uVar11 + 1;
                total = total - uVar17;
              }
            }
            uVar16 = uVar9 - uVar11;
          }
          if (uVar11 != maxSymbolValue + 1) {
            if (total == 0) {
              uVar9 = 0;
              while (uVar16 != 0) {
                if (0 < normalizedCounter[uVar9]) {
                  uVar16 = uVar16 - 1;
                  normalizedCounter[uVar9] = normalizedCounter[uVar9] + 1;
                }
                bVar19 = uVar9 == maxSymbolValue;
                uVar9 = uVar9 + 1;
                if (bVar19) {
                  uVar9 = 0;
                }
              }
              return uVar12;
            }
            uVar18 = ~(-1L << (cVar2 + 0x3dU & 0x3f));
            uVar9 = 0;
            uVar5 = uVar18;
            do {
              if (maxSymbolValue < uVar9) {
                return uVar12;
              }
              uVar15 = uVar5;
              if (normalizedCounter[uVar9] == -2) {
                uVar15 = (ulong)count[uVar9] *
                         ((((ulong)uVar16 << (bVar7 & 0x3f)) + uVar18) / total) + uVar5;
                uVar5 = uVar5 >> (bVar7 & 0x3f);
                uVar14 = uVar15 >> (bVar7 & 0x3f);
                if (uVar14 == uVar5) {
                  return 0xffffffffffffffff;
                }
                normalizedCounter[uVar9] = (short)uVar14 - (short)uVar5;
              }
              uVar9 = uVar9 + 1;
              uVar5 = uVar15;
            } while( true );
          }
          uVar5 = 0;
          uVar9 = 0;
          for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
            if (uVar9 < count[uVar15]) {
              uVar5 = uVar15 & 0xffffffff;
              uVar9 = count[uVar15];
            }
          }
          psVar10 = normalizedCounter + uVar5;
          sVar4 = *psVar10;
        }
        else {
          psVar10 = normalizedCounter + uVar18;
        }
        *psVar10 = sVar4 + (short)uVar16;
        sVar6 = uVar12;
      }
    }
    else {
      sVar6 = 0xffffffffffffffd4;
    }
  }
  return sVar6;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        U64 const scale = 62 - tableLog;
        U64 const step = ((U64)1<<62) / total;   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = -1;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}